

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.cpp
# Opt level: O2

void print_usage(void)

{
  puts("-------------------------------");
  puts("manifold_test specific options:");
  puts("  -h: Print this message");
  puts("  -e: Export GLB models of samples");
  puts("  -c: Enable self-intersection checks (needs MANIFOLD_DEBUG)");
  puts("  -v: Enable verbose output (only works if compiled with MANIFOLD_DEBUG flag)");
  puts(
      "  -vv: Enable extra verbose output for triangulator (only works if compiled with MANIFOLD_DEBUG flag)"
      );
  return;
}

Assistant:

void print_usage() {
  printf("-------------------------------\n");
  printf("manifold_test specific options:\n");
  printf("  -h: Print this message\n");
  printf("  -e: Export GLB models of samples\n");
  printf("  -c: Enable self-intersection checks (needs MANIFOLD_DEBUG)\n");
  printf(
      "  -v: Enable verbose output (only works if compiled with MANIFOLD_DEBUG "
      "flag)\n");
  printf(
      "  -vv: Enable extra verbose output for triangulator (only works if "
      "compiled with MANIFOLD_DEBUG flag)\n");
}